

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWRaster.cpp
# Opt level: O3

Cell * __thiscall TRM::SWRaster::find_cell(SWRaster *this)

{
  unordered_map<int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>_>
  *this_00;
  int32_t *__k;
  int iVar1;
  int iVar2;
  iterator __position;
  value_type *__val;
  const_iterator cVar3;
  mapped_type *pmVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  pointer pCVar8;
  pointer pCVar9;
  vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_> local_30;
  
  this_00 = &this->m_cells_y;
  __k = &this->m_ey;
  cVar3 = std::
          _Hashtable<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,__k);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_30.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0xc);
    local_30.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_30.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
         _M_impl.super__Vector_impl_data._M_start + 1;
    (local_30.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
     super__Vector_impl_data._M_start)->x = 0;
    (local_30.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
     super__Vector_impl_data._M_start)->cover = 0;
    (local_30.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
     super__Vector_impl_data._M_start)->area = 0;
    local_30.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_30.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::operator=
              (pmVar4,&local_30);
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    pCVar9 = (pmVar4->super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar9->x = this->m_ex;
    pCVar9->cover = 0;
    pCVar9->area = 0;
    if (local_30.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.
                      super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_30.
                            super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.
                            super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    pCVar9 = (pmVar4->super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (pmVar4->super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if ((long)__position._M_current - (long)pCVar9 != 0) {
      lVar6 = ((long)__position._M_current - (long)pCVar9 >> 2) * -0x5555555555555555;
      iVar1 = this->m_ex;
      lVar5 = 0;
      lVar7 = 0;
      pCVar8 = pCVar9;
      do {
        iVar2 = pCVar8->x;
        if (iVar2 == iVar1) {
          return pCVar8;
        }
        if (iVar2 != iVar1 && iVar1 <= iVar2) {
          if ((int)lVar7 != -1) {
            lVar5 = (lVar5 >> 0x1e) * 3;
            local_30.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_30.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((ulong)local_30.
                                  super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
            std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::_M_insert_rval
                      (pmVar4,(Cell *)((long)&pCVar9->x + lVar5),(value_type *)&local_30);
            pCVar9 = (pointer)((long)&((pmVar4->
                                       super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->x + lVar5);
            goto LAB_00116e73;
          }
          break;
        }
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 0x100000000;
        pCVar8 = pCVar8 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
    }
    local_30.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_30.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)local_30.
                          super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
    if (__position._M_current ==
        (pmVar4->super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::
      _M_realloc_insert<TRM::SWRaster::Cell>(pmVar4,__position,(Cell *)&local_30);
      pCVar9 = (pmVar4->
               super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (__position._M_current)->area = 0;
      (__position._M_current)->x = 0;
      (__position._M_current)->cover = 0;
      pCVar9 = (pmVar4->
               super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>).
               _M_impl.super__Vector_impl_data._M_finish + 1;
      (pmVar4->super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>).
      _M_impl.super__Vector_impl_data._M_finish = pCVar9;
    }
    pCVar9 = pCVar9 + -1;
LAB_00116e73:
    pCVar9->x = this->m_ex;
    pCVar9->cover = 0;
    pCVar9->area = 0;
  }
  return pCVar9;
}

Assistant:

SWRaster::Cell* SWRaster::find_cell() {
  if (m_cells_y.count(m_ey) == 0) {
    std::vector<Cell> list(1);
    m_cells_y[m_ey] = list;

    auto cell = &m_cells_y[m_ey][0];
    cell->x = m_ex;
    cell->area = 0;
    cell->cover = 0;
    return cell;
  }

  auto& list = m_cells_y[m_ey];

  int32_t index = -1;
  for (size_t i = 0; i < list.size(); i++) {
    if (list[i].x == m_ex) {
      return &list[i];
    }

    if (list[i].x > m_ex) {
      index = i;
      break;
    }
  }

  Cell* cell = nullptr;
  if (index != -1) {
    list.insert(list.begin() + index, Cell{});
    cell = &list[index];
  } else {
    list.emplace_back(Cell{});
    cell = &list.back();
  }

  cell->x = m_ex;
  cell->area = 0;
  cell->cover = 0;

  return cell;
}